

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_cross_entropy_loss(ggml_compute_params *params,ggml_tensor *dst)

{
  float *y;
  int iVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  double dVar21;
  byte bVar22;
  byte bVar23;
  char cVar24;
  int i;
  size_t sVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  char *pcVar30;
  float *pfVar31;
  ulong uVar32;
  long lVar33;
  undefined8 uVar34;
  uint n;
  long lVar35;
  int64_t i1;
  long lVar36;
  ushort uVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 extraout_var [56];
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x21bf,"fatal error");
  }
  pgVar4 = dst->src[1];
  if (pgVar4->type == GGML_TYPE_F32) {
    sVar5 = pgVar3->nb[0];
    sVar25 = ggml_type_size(0);
    if (sVar5 == sVar25) {
      sVar5 = pgVar4->nb[0];
      sVar25 = ggml_type_size(pgVar4->type);
      if (sVar5 == sVar25) {
        cVar24 = ggml_are_same_shape(pgVar3,pgVar4);
        if (cVar24 == '\0') {
          pcVar30 = "ggml_are_same_shape(src0, src1)";
          uVar34 = 0x2171;
        }
        else {
          cVar24 = ggml_is_scalar(dst);
          if (cVar24 == '\0') {
            pcVar30 = "ggml_is_scalar(dst)";
            uVar34 = 0x2172;
          }
          else if (dst->type == GGML_TYPE_F32) {
            lVar29 = pgVar3->ne[0];
            lVar26 = ggml_nrows(pgVar3);
            iVar1 = params->nth;
            lVar33 = (long)iVar1;
            if ((ulong)((lVar29 * 4 + 4) * lVar33) <= params->wsize) {
              pvVar6 = params->wdata;
              iVar2 = params->ith;
              lVar35 = (long)iVar2;
              fVar45 = 0.0;
              lVar27 = (lVar26 + -1 + lVar33) / lVar33;
              lVar36 = lVar27 * lVar35;
              lVar27 = lVar27 + lVar36;
              if (lVar26 <= lVar27) {
                lVar27 = lVar26;
              }
              if (lVar36 < lVar27) {
                n = (uint)lVar29;
                uVar32 = (ulong)(n & 0x7fffffff);
                y = (float *)((long)pvVar6 + lVar29 * lVar35 * 4 + lVar33 * 4);
                auVar38 = vpbroadcastq_avx512f();
                auVar38 = vmovdqu64_avx512f(auVar38);
                fVar45 = 0.0;
                do {
                  pfVar31 = (float *)(pgVar3->nb[1] * lVar36 + (long)pgVar3->data);
                  if ((int)n < 1) {
                    ggml_vec_log_soft_max_f32(n,y,pfVar31,-INFINITY);
                    fVar44 = 0.0;
                  }
                  else {
                    auVar47 = ZEXT464(0xff800000);
                    sVar5 = pgVar4->nb[1];
                    pvVar7 = pgVar4->data;
                    uVar28 = 0;
                    do {
                      auVar46 = vmaxss_avx(auVar47._0_16_,ZEXT416((uint)pfVar31[uVar28]));
                      auVar47 = ZEXT1664(auVar46);
                      uVar28 = uVar28 + 1;
                    } while (uVar32 != uVar28);
                    auVar41._0_8_ = ggml_vec_log_soft_max_f32(n,y,pfVar31,auVar46._0_4_);
                    auVar41._8_56_ = extraout_var;
                    auVar47 = vmovdqu64_avx512f(auVar38);
                    auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar46._0_4_ = (float)auVar41._0_8_;
                    auVar46._4_12_ = auVar41._4_12_;
                    uVar28 = 0;
                    auVar41 = vbroadcastss_avx512f(auVar46);
                    do {
                      auVar42 = vpbroadcastq_avx512f();
                      auVar43 = vporq_avx512f(auVar42,auVar39);
                      auVar42 = vporq_avx512f(auVar42,auVar40);
                      uVar34 = vpcmpuq_avx512f(auVar42,auVar47,2);
                      bVar22 = (byte)uVar34;
                      uVar34 = vpcmpuq_avx512f(auVar43,auVar47,2);
                      bVar23 = (byte)uVar34;
                      uVar37 = CONCAT11(bVar23,bVar22);
                      pfVar31 = y + uVar28;
                      auVar42._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * (int)pfVar31[1];
                      auVar42._0_4_ = (uint)(bVar22 & 1) * (int)*pfVar31;
                      auVar42._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * (int)pfVar31[2];
                      auVar42._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * (int)pfVar31[3];
                      auVar42._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * (int)pfVar31[4];
                      auVar42._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * (int)pfVar31[5];
                      auVar42._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * (int)pfVar31[6];
                      auVar42._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * (int)pfVar31[7];
                      auVar42._32_4_ = (uint)(bVar23 & 1) * (int)pfVar31[8];
                      auVar42._36_4_ = (uint)(bVar23 >> 1 & 1) * (int)pfVar31[9];
                      auVar42._40_4_ = (uint)(bVar23 >> 2 & 1) * (int)pfVar31[10];
                      auVar42._44_4_ = (uint)(bVar23 >> 3 & 1) * (int)pfVar31[0xb];
                      auVar42._48_4_ = (uint)(bVar23 >> 4 & 1) * (int)pfVar31[0xc];
                      auVar42._52_4_ = (uint)(bVar23 >> 5 & 1) * (int)pfVar31[0xd];
                      auVar42._56_4_ = (uint)(bVar23 >> 6 & 1) * (int)pfVar31[0xe];
                      auVar42._60_4_ = (uint)(bVar23 >> 7) * (int)pfVar31[0xf];
                      auVar42 = vsubps_avx512f(auVar42,auVar41);
                      pfVar31 = y + uVar28;
                      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar37 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar37 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar37 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar37 >> 7) & 1);
                      bVar15 = (bool)(bVar23 >> 1 & 1);
                      bVar16 = (bool)(bVar23 >> 2 & 1);
                      bVar17 = (bool)(bVar23 >> 3 & 1);
                      bVar18 = (bool)(bVar23 >> 4 & 1);
                      bVar19 = (bool)(bVar23 >> 5 & 1);
                      bVar20 = (bool)(bVar23 >> 6 & 1);
                      *pfVar31 = (float)((uint)(bVar22 & 1) * auVar42._0_4_ |
                                        (uint)!(bool)(bVar22 & 1) * (int)*pfVar31);
                      pfVar31[1] = (float)((uint)bVar8 * auVar42._4_4_ |
                                          (uint)!bVar8 * (int)pfVar31[1]);
                      pfVar31[2] = (float)((uint)bVar9 * auVar42._8_4_ |
                                          (uint)!bVar9 * (int)pfVar31[2]);
                      pfVar31[3] = (float)((uint)bVar10 * auVar42._12_4_ |
                                          (uint)!bVar10 * (int)pfVar31[3]);
                      pfVar31[4] = (float)((uint)bVar11 * auVar42._16_4_ |
                                          (uint)!bVar11 * (int)pfVar31[4]);
                      pfVar31[5] = (float)((uint)bVar12 * auVar42._20_4_ |
                                          (uint)!bVar12 * (int)pfVar31[5]);
                      pfVar31[6] = (float)((uint)bVar13 * auVar42._24_4_ |
                                          (uint)!bVar13 * (int)pfVar31[6]);
                      pfVar31[7] = (float)((uint)bVar14 * auVar42._28_4_ |
                                          (uint)!bVar14 * (int)pfVar31[7]);
                      pfVar31[8] = (float)((uint)(bVar23 & 1) * auVar42._32_4_ |
                                          (uint)!(bool)(bVar23 & 1) * (int)pfVar31[8]);
                      pfVar31[9] = (float)((uint)bVar15 * auVar42._36_4_ |
                                          (uint)!bVar15 * (int)pfVar31[9]);
                      pfVar31[10] = (float)((uint)bVar16 * auVar42._40_4_ |
                                           (uint)!bVar16 * (int)pfVar31[10]);
                      pfVar31[0xb] = (float)((uint)bVar17 * auVar42._44_4_ |
                                            (uint)!bVar17 * (int)pfVar31[0xb]);
                      pfVar31[0xc] = (float)((uint)bVar18 * auVar42._48_4_ |
                                            (uint)!bVar18 * (int)pfVar31[0xc]);
                      pfVar31[0xd] = (float)((uint)bVar19 * auVar42._52_4_ |
                                            (uint)!bVar19 * (int)pfVar31[0xd]);
                      pfVar31[0xe] = (float)((uint)bVar20 * auVar42._56_4_ |
                                            (uint)!bVar20 * (int)pfVar31[0xe]);
                      pfVar31[0xf] = (float)((uint)(bVar23 >> 7) * auVar42._60_4_ |
                                            (uint)!(bool)(bVar23 >> 7) * (int)pfVar31[0xf]);
                      uVar28 = uVar28 + 0x10;
                    } while ((n + 0xf & 0xfffffff0) != uVar28);
                    uVar28 = 0;
                    do {
                      y[uVar28] = y[uVar28] * *(float *)((long)pvVar7 + uVar28 * 4 + sVar5 * lVar36)
                      ;
                      uVar28 = uVar28 + 1;
                    } while (uVar32 != uVar28);
                    auVar47 = ZEXT1264(ZEXT812(0));
                    uVar28 = 0;
                    do {
                      pfVar31 = y + uVar28;
                      uVar28 = uVar28 + 1;
                      dVar21 = auVar47._0_8_ + (double)*pfVar31;
                      auVar47 = ZEXT864((ulong)dVar21);
                    } while (uVar32 != uVar28);
                    fVar44 = (float)dVar21;
                  }
                  lVar36 = lVar36 + 1;
                  fVar45 = fVar45 + fVar44;
                } while (lVar36 != lVar27);
              }
              *(float *)((long)pvVar6 + lVar35 * 4) = fVar45;
              ggml_barrier(params->threadpool);
              if (iVar2 == 0) {
                if (iVar1 < 1) {
                  fVar45 = 0.0;
                }
                else {
                  fVar45 = 0.0;
                  lVar29 = 0;
                  do {
                    lVar27 = lVar29 * 4;
                    lVar29 = lVar29 + 1;
                    fVar45 = fVar45 + *(float *)((long)pvVar6 + lVar27);
                  } while (lVar33 != lVar29);
                }
                *(float *)dst->data = (-1.0 / (float)lVar26) * fVar45;
              }
              return;
            }
            pcVar30 = "params->wsize >= sizeof(float) * (nth + nth * nc)";
            uVar34 = 0x2180;
          }
          else {
            pcVar30 = "dst->type == GGML_TYPE_F32";
            uVar34 = 0x2173;
          }
        }
      }
      else {
        pcVar30 = "src1->nb[0] == ggml_type_size(src1->type)";
        uVar34 = 0x2170;
      }
    }
    else {
      pcVar30 = "src0->nb[0] == ggml_type_size(src0->type)";
      uVar34 = 0x216f;
    }
  }
  else {
    pcVar30 = "src1->type == GGML_TYPE_F32";
    uVar34 = 0x216e;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar34,"GGML_ASSERT(%s) failed",pcVar30);
}

Assistant:

void ggml_compute_forward_cross_entropy_loss(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_cross_entropy_loss_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}